

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

string * pstore::file::file_handle::get_temporary_directory_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_4d [20];
  allocator local_39;
  char *local_38;
  czstring val;
  czstring name;
  const_iterator __end2;
  const_iterator __begin2;
  array<const_char_*,_4UL> *__range2;
  
  __begin2 = get_temporary_directory::env_var_names._M_elems;
  __end2 = std::array<const_char_*,_4UL>::begin(&get_temporary_directory::env_var_names);
  name = (czstring)std::array<const_char_*,_4UL>::end(&get_temporary_directory::env_var_names);
  while( true ) {
    if (__end2 == (const_iterator)name) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"/tmp",local_4d);
      std::allocator<char>::~allocator((allocator<char> *)local_4d);
      return in_RDI;
    }
    val = *__end2;
    pcVar1 = getenv(val);
    if (pcVar1 != (char *)0x0) break;
    __end2 = __end2 + 1;
    local_38 = (char *)0x0;
  }
  local_38 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

std::string file_handle::get_temporary_directory () {
            // Following boost filesystem, we check some select environment variables
            // for user temporary directories before resorting to /tmp.
            static constexpr std::array<gsl::czstring, 4> env_var_names{{
                "TMPDIR",
                "TMP",
                "TEMP",
                "TEMPDIR",
            }};
            for (gsl::czstring const name : env_var_names) {
                if (gsl::czstring const val = std::getenv (name)) {
                    return val;
                }
            }
            return "/tmp";
        }